

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_compileData *
MOJOSHADER_compile(char *srcprofile,char *filename,char *source,uint sourcelen,
                  MOJOSHADER_preprocessorDefine *defs,uint define_count,
                  MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close,
                  MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  Context_conflict *ctx_00;
  Context_conflict *ctx;
  MOJOSHADER_compileData *retval;
  uint define_count_local;
  MOJOSHADER_preprocessorDefine *defs_local;
  uint sourcelen_local;
  char *source_local;
  char *filename_local;
  char *srcprofile_local;
  
  if (((m == (MOJOSHADER_malloc)0x0) && (f != (MOJOSHADER_free)0x0)) ||
     ((m != (MOJOSHADER_malloc)0x0 && (f == (MOJOSHADER_free)0x0)))) {
    srcprofile_local = (char *)&MOJOSHADER_out_of_mem_compile_data;
  }
  else {
    ctx_00 = build_context(m,f,d);
    if (ctx_00 == (Context_conflict *)0x0) {
      srcprofile_local = (char *)&MOJOSHADER_out_of_mem_compile_data;
    }
    else {
      choose_src_profile(ctx_00,srcprofile);
      iVar1 = isfail(ctx_00);
      if (iVar1 == 0) {
        parse_source(ctx_00,filename,source,sourcelen,defs,define_count,include_open,include_close);
      }
      iVar1 = isfail(ctx_00);
      if (iVar1 == 0) {
        semantic_analysis(ctx_00);
      }
      iVar1 = isfail(ctx_00);
      if (iVar1 == 0) {
        intermediate_representation(ctx_00);
      }
      iVar1 = isfail(ctx_00);
      if (iVar1 == 0) {
        ctx = (Context_conflict *)build_compiledata(ctx_00);
      }
      else {
        ctx = (Context_conflict *)build_failed_compile(ctx_00);
      }
      destroy_context(ctx_00);
      srcprofile_local = (char *)ctx;
    }
  }
  return (MOJOSHADER_compileData *)srcprofile_local;
}

Assistant:

const MOJOSHADER_compileData *MOJOSHADER_compile(const char *srcprofile,
                                    const char *filename, const char *source,
                                    unsigned int sourcelen,
                                    const MOJOSHADER_preprocessorDefine *defs,
                                    unsigned int define_count,
                                    MOJOSHADER_includeOpen include_open,
                                    MOJOSHADER_includeClose include_close,
                                    MOJOSHADER_malloc m, MOJOSHADER_free f,
                                    void *d)
{
    // !!! FIXME: cut and paste from MOJOSHADER_parseAst().
    MOJOSHADER_compileData *retval = NULL;
    Context *ctx = NULL;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_compile_data;  // supply both or neither.

    ctx = build_context(m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_compile_data;

    choose_src_profile(ctx, srcprofile);

    if (!isfail(ctx))
    {
        parse_source(ctx, filename, source, sourcelen, defs, define_count,
                     include_open, include_close);
    } // if

    if (!isfail(ctx))
        semantic_analysis(ctx);

    if (!isfail(ctx))
        intermediate_representation(ctx);

    if (isfail(ctx))
        retval = (MOJOSHADER_compileData *) build_failed_compile(ctx);
    else
        retval = (MOJOSHADER_compileData *) build_compiledata(ctx);

    destroy_context(ctx);
    return retval;
}